

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O3

void __thiscall
chrono::ChConveyor::ChConveyor(ChConveyor *this,double xlength,double ythick,double zwidth)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 auVar4 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ChBody *pCVar6;
  ChLinkLockLock *this_00;
  ChMarker *pCVar7;
  size_t in_RSI;
  size_t sVar8;
  shared_ptr<chrono::ChFunction> *m_funct;
  shared_ptr<chrono::ChMarker> mmark2;
  shared_ptr<chrono::ChMarker> mmark1;
  undefined1 local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  undefined8 local_d8;
  shared_ptr<chrono::ChMarker> local_c8;
  shared_ptr<chrono::ChMarker> local_b8;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  double local_90;
  double local_88;
  double local_80;
  shared_ptr<chrono::ChFunction> local_78;
  ChMarker *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined1 auStack_58 [16];
  undefined8 uStack_48;
  undefined1 auStack_40 [24];
  undefined8 local_28;
  
  local_90 = zwidth;
  local_88 = ythick;
  local_80 = xlength;
  ChObj::ChObj((ChObj *)this);
  *(undefined8 *)
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_ChPhysicsItem).offset_w = 0;
  (this->super_ChPhysicsItem).offset_L = 0;
  (this->super_ChPhysicsItem).system = (ChSystem *)0x0;
  (this->super_ChPhysicsItem).vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChPhysicsItem).vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChPhysicsItem).cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChConveyor_00b10aa0;
  this->conveyor_speed = 1.0;
  (this->conveyor_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->conveyor_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pCVar6 = (ChBody *)ChFrame<double>::operator_new((ChFrame<double> *)0x360,in_RSI);
  sVar8 = 0;
  ChBody::ChBody(pCVar6,BULLET);
  this->conveyor_truss = pCVar6;
  pCVar6 = (ChBody *)ChFrame<double>::operator_new((ChFrame<double> *)0x360,sVar8);
  ChBody::ChBody(pCVar6,BULLET);
  this->conveyor_plate = pCVar6;
  local_68 = (ChMarker *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChMaterialSurfaceNSC,std::allocator<chrono::ChMaterialSurfaceNSC>>
            (&_Stack_60,(ChMaterialSurfaceNSC **)&local_68,
             (allocator<chrono::ChMaterialSurfaceNSC> *)local_e8);
  _Var5._M_pi = _Stack_60._M_pi;
  pCVar7 = local_68;
  local_68 = (ChMarker *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->conveyor_mat).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->conveyor_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pCVar7;
  (this->conveyor_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
  }
  peVar2 = (this->conveyor_plate->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var1 = (this->conveyor_plate->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_ChCollisionModel[3])();
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (this->conveyor_plate->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var1 = (this->conveyor_plate->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_a8 = (this->conveyor_mat).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_a0 = (this->conveyor_mat).
               super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  p_Var3 = (this->conveyor_mat).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  _local_e8 = ZEXT816(0) << 0x20;
  local_d8 = 0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auStack_40 = SUB3224(ZEXT832(0),4);
  auStack_58 = SUB3216(ZEXT832(0),4);
  local_68 = (ChMarker *)0x3ff0000000000000;
  uStack_48 = 0x3ff0000000000000;
  local_28 = 0x3ff0000000000000;
  (*peVar2->_vptr_ChCollisionModel[7])(peVar2,&local_a8);
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (this->conveyor_plate->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var1 = (this->conveyor_plate->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_ChCollisionModel[4])();
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  sVar8 = 1;
  ChBody::SetCollide(this->conveyor_plate,true);
  this_00 = (ChLinkLockLock *)ChLinkLock::operator_new((ChLinkLock *)0x1060,sVar8);
  ChLinkLockLock::ChLinkLockLock(this_00);
  this->internal_link = this_00;
  local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x28);
  auVar4 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  m_funct = &local_78;
  (local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b10d00;
  local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b458a8;
  *(undefined1 (*) [16])
   &local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
    ._M_use_count = auVar4;
  ChLinkLockLock::SetMotion_X(this_00,m_funct);
  if (local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pCVar7 = (ChMarker *)ChFrame<double>::operator_new((ChFrame<double> *)0x340,(size_t)m_funct);
  ChMarker::ChMarker(pCVar7);
  local_68 = pCVar7;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChMarker*>
            (&_Stack_60,pCVar7);
  pCVar7 = (ChMarker *)ChFrame<double>::operator_new((ChFrame<double> *)0x340,(size_t)pCVar7);
  ChMarker::ChMarker(pCVar7);
  local_e8 = (undefined1  [8])pCVar7;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChMarker*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),pCVar7);
  pCVar6 = this->conveyor_truss;
  local_b8.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
  local_b8.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_60._M_pi;
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
    }
  }
  ChBody::AddMarker(pCVar6,&local_b8);
  if (local_b8.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  pCVar6 = this->conveyor_plate;
  local_c8.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_e8;
  local_c8.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_e0._M_pi;
  if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_e0._M_pi)->_M_use_count = (_Stack_e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_e0._M_pi)->_M_use_count = (_Stack_e0._M_pi)->_M_use_count + 1;
    }
  }
  ChBody::AddMarker(pCVar6,&local_c8);
  if (local_c8.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  ChLinkMarkers::ReferenceMarkers
            ((ChLinkMarkers *)this->internal_link,local_68,(ChMarker *)local_e8);
  if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  return;
}

Assistant:

ChConveyor::ChConveyor(double xlength, double ythick, double zwidth) : conveyor_speed(1) {
    conveyor_truss = new ChBody;
    conveyor_plate = new ChBody;

    conveyor_mat = chrono_types::make_shared<ChMaterialSurfaceNSC>();

    conveyor_plate->GetCollisionModel()->ClearModel();
    conveyor_plate->GetCollisionModel()->AddBox(conveyor_mat, xlength * 0.5, ythick * 0.5, zwidth * 0.5);
    conveyor_plate->GetCollisionModel()->BuildModel();
    conveyor_plate->SetCollide(true);

    internal_link = new ChLinkLockLock;
    internal_link->SetMotion_X(chrono_types::make_shared<ChFunction_Ramp>());

    std::shared_ptr<ChMarker> mmark1(new ChMarker);
    std::shared_ptr<ChMarker> mmark2(new ChMarker);
    conveyor_truss->AddMarker(mmark1);
    conveyor_plate->AddMarker(mmark2);

    internal_link->ReferenceMarkers(mmark1.get(), mmark2.get());
}